

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::NewScObjectNoArg(Var instance,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  ScriptContext *requestContext_00;
  bool bVar4;
  bool bVar5;
  Attributes AVar6;
  BOOL BVar7;
  JavascriptProxy *function;
  RecyclableObject *pRVar8;
  FunctionInfo *functionInfo;
  RecyclableObject *instance_00;
  undefined4 *puVar9;
  JavascriptArray *object;
  RecyclableObject *ptr;
  JavascriptFunction *pJVar10;
  ConstructorCache *pCVar11;
  DynamicObject *value;
  Var pvVar12;
  uint lineNumber;
  JavascriptLibrary *this;
  anon_class_32_3_16037d12 local_78;
  ScriptContext *local_58;
  ThreadContext *local_50;
  Var dummy;
  RecyclableObject *local_40;
  bool local_32;
  ImplicitCallFlags local_31;
  
  bVar4 = VarIs<Js::JavascriptProxy>(instance);
  if ((bVar4) &&
     (function = UnsafeVarTo<Js::JavascriptProxy>(instance), function != (JavascriptProxy *)0x0)) {
    local_78.args.Values = &stack0xffffffffffffffb0;
    local_50 = (ThreadContext *)0x0;
    pTVar2 = requestContext->threadContext;
    local_78.args.Info =
         (Type)((long)
                L"The use of a future reserved word for an identifier is invalid. The identifier name is reserved in strict mode."
               + 0xdb);
    bVar4 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    local_78.proxy = function;
    local_78.requestContext = requestContext;
    AVar6 = FunctionInfo::GetAttributes((RecyclableObject *)function);
    bVar5 = ThreadContext::HasNoSideEffect(pTVar2,(RecyclableObject *)function,AVar6);
    if (bVar5) {
      pRVar8 = (RecyclableObject *)NewScObjectNoArg::anon_class_32_3_16037d12::operator()(&local_78)
      ;
      bVar5 = ThreadContext::IsOnStack(pRVar8);
    }
    else {
      if ((pTVar2->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
        pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
        pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                   super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
        goto LAB_009a331b;
      }
      if ((AVar6 & HasNoSideEffect) == None) {
        IVar1 = pTVar2->implicitCallFlags;
        pRVar8 = (RecyclableObject *)
                 NewScObjectNoArg::anon_class_32_3_16037d12::operator()(&local_78);
        pTVar2->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        goto LAB_009a331b;
      }
      pRVar8 = (RecyclableObject *)NewScObjectNoArg::anon_class_32_3_16037d12::operator()(&local_78)
      ;
      bVar5 = ThreadContext::IsOnStack(pRVar8);
    }
    if (bVar5 != false) {
      pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
    }
LAB_009a331b:
    pTVar2->reentrancySafeOrHandled = bVar4;
    return pRVar8;
  }
  functionInfo = GetConstructorFunctionInfo(instance,requestContext);
  pRVar8 = VarTo<Js::RecyclableObject>(instance);
  if (functionInfo == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
    if ((JavascriptObject::EntryInfo::NewInstance[0x18] & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x18c1,
                                  "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                  ,"(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                 );
      if (!bVar4) goto LAB_009a3431;
      *puVar9 = 0;
    }
    this = (((pRVar8->type).ptr)->javascriptLibrary).ptr;
    object = (JavascriptArray *)JavascriptLibrary::CreateObject(this,true,0);
    bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar4) {
      pRVar8 = JavascriptProxy::AutoProxyWrapper(object);
      object = (JavascriptArray *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar8);
    }
    if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                         .ptr[1].javascriptLibrary.ptr + 1) == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x18cf,"(newObjectType->GetIsShared())",
                                  "newObjectType->GetIsShared()");
      if (!bVar4) goto LAB_009a3431;
      *puVar9 = 0;
    }
    pJVar10 = VarTo<Js::JavascriptFunction>(instance);
    pCVar11 = JavascriptFunction::GetConstructorCache(pJVar10);
    if ((pCVar11->content).updateAfterCtor != true) goto LAB_009a31e6;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    lineNumber = 0x18d2;
  }
  else {
    if (functionInfo != (FunctionInfo *)JavascriptArray::EntryInfo::NewInstance) {
      local_58 = requestContext;
      if (functionInfo == (FunctionInfo *)0x0) {
        instance_00 = (RecyclableObject *)NewScObjectHostDispatchOrProxy(pRVar8,requestContext);
      }
      else {
        instance_00 = (RecyclableObject *)
                      NewScObjectCommon(pRVar8,functionInfo,requestContext,false);
      }
      pTVar2 = ((((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->threadContext;
      local_32 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      local_50 = pTVar2;
      dummy = pRVar8;
      local_40 = instance_00;
      AVar6 = FunctionInfo::GetAttributes(pRVar8);
      bVar4 = ThreadContext::HasNoSideEffect(pTVar2,pRVar8,AVar6);
      if (bVar4) {
        ptr = (RecyclableObject *)
              NewScObjectNoArg::anon_class_24_3_52a5356e::operator()
                        ((anon_class_24_3_52a5356e *)&stack0xffffffffffffffb0);
        bVar4 = ThreadContext::IsOnStack(ptr);
      }
      else {
        if ((pTVar2->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
          pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                    scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
          goto LAB_009a334a;
        }
        if ((AVar6 & HasNoSideEffect) == None) {
          local_31 = pTVar2->implicitCallFlags;
          ptr = (RecyclableObject *)
                NewScObjectNoArg::anon_class_24_3_52a5356e::operator()
                          ((anon_class_24_3_52a5356e *)&stack0xffffffffffffffb0);
          pTVar2->implicitCallFlags = local_31 | ImplicitCall_Accessor;
          goto LAB_009a334a;
        }
        ptr = (RecyclableObject *)
              NewScObjectNoArg::anon_class_24_3_52a5356e::operator()
                        ((anon_class_24_3_52a5356e *)&stack0xffffffffffffffb0);
        bVar4 = ThreadContext::IsOnStack(ptr);
      }
      if (bVar4 != false) {
        pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
      }
LAB_009a334a:
      pTVar2->reentrancySafeOrHandled = local_32;
      BVar7 = IsObject(ptr);
      if (BVar7 != 0) {
        instance_00 = ptr;
      }
      bVar4 = VarIs<Js::JavascriptFunction>(instance);
      requestContext_00 = local_58;
      if ((((bVar4) &&
           (pJVar10 = UnsafeVarTo<Js::JavascriptFunction>(instance),
           pJVar10 != (JavascriptFunction *)0x0)) &&
          (pCVar11 = JavascriptFunction::GetConstructorCache(pJVar10),
          pCVar11 != (ConstructorCache *)0x0)) && ((pCVar11->content).updateAfterCtor == true)) {
        UpdateNewScObjectCache(pRVar8,instance_00,requestContext_00);
      }
      bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (!bVar4) {
        return instance_00;
      }
      pRVar8 = JavascriptProxy::AutoProxyWrapper(instance_00);
      value = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar8);
      pvVar12 = CrossSite::MarshalVar
                          (requestContext_00,value,
                           (((((value->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
      return pvVar12;
    }
    if ((JavascriptArray::EntryInfo::NewInstance[0x18] & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x18df,
                                  "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                  ,"(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                 );
      if (!bVar4) goto LAB_009a3431;
      *puVar9 = 0;
    }
    this = (((pRVar8->type).ptr)->javascriptLibrary).ptr;
    object = JavascriptLibrary::CreateArray(this);
    bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar4) {
      object = (JavascriptArray *)JavascriptProxy::AutoProxyWrapper(object);
    }
    if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                         .ptr[1].javascriptLibrary.ptr + 1) == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x18ed,"(newArrayType->GetIsShared())",
                                  "newArrayType->GetIsShared()");
      if (!bVar4) goto LAB_009a3431;
      *puVar9 = 0;
    }
    pJVar10 = VarTo<Js::JavascriptFunction>(instance);
    pCVar11 = JavascriptFunction::GetConstructorCache(pJVar10);
    if ((pCVar11->content).updateAfterCtor != true) goto LAB_009a31e6;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    lineNumber = 0x18f0;
  }
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,lineNumber,
                              "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                              "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
  if (!bVar4) {
LAB_009a3431:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar9 = 0;
LAB_009a31e6:
  if ((this->super_JavascriptLibraryBase).scriptContext.ptr != requestContext) {
    CrossSite::MarshalDynamicObjectAndPrototype(requestContext,(DynamicObject *)object);
  }
  return object;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArg(Var instance, ScriptContext * requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            Var dummy = nullptr;
            Arguments args(CallInfo(CallFlags_New, 1), &dummy);
            return requestContext->GetThreadContext()->ExecuteImplicitCall(proxy, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return proxy->ConstructorTrap(args, requestContext, 0);
            });
        }

        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        RecyclableObject * object = VarTo<RecyclableObject>(instance);

        if (functionInfo == &JavascriptObject::EntryInfo::NewInstance)
        {
            // Fast path for new Object()
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            DynamicObject * newObject = library->CreateObject(true);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            }
#endif

#if DBG
            DynamicType* newObjectType = newObject->GetDynamicType();
            Assert(newObjectType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newObject);
            }

            return newObject;
        }
        else if (functionInfo == &JavascriptArray::EntryInfo::NewInstance)
        {
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            JavascriptArray * newArray = library->CreateArray();
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
            }
#endif

#if DBG
            DynamicType* newArrayType = newArray->GetDynamicType();
            Assert(newArrayType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newArray);
            }
            return newArray;
        }

        Var newObject = functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);

        ThreadContext * threadContext = object->GetScriptContext()->GetThreadContext();
        Var returnVar = threadContext->ExecuteImplicitCall(object, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, object, CallInfo(CallFlags_New, 1), newObject);
        });
        if (JavascriptOperators::IsObject(returnVar))
        {
            newObject = returnVar;
        }

        ConstructorCache * constructorCache = nullptr;
        JavascriptFunction *function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        if (function)
        {
            constructorCache = function->GetConstructorCache();
        }

        if (constructorCache != nullptr && constructorCache->NeedsUpdateAfterCtor())
        {
            JavascriptOperators::UpdateNewScObjectCache(object, newObject, requestContext);
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            DynamicObject* newDynamicObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            // this might come from a different scriptcontext.
            newObject = CrossSite::MarshalVar(requestContext, newDynamicObject, newDynamicObject->GetScriptContext());
        }
#endif

        return newObject;
        JIT_HELPER_END(NewScObjectNoArg);
    }